

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentInvoker.h
# Opt level: O2

int __thiscall
aeron::concurrent::AgentInvoker<aeron::ClientConductor>::invoke
          (AgentInvoker<aeron::ClientConductor> *this)

{
  int iVar1;
  
  iVar1 = 0;
  if (this->m_isRunning == true) {
    iVar1 = ClientConductor::doWork(this->m_agent);
  }
  return iVar1;
}

Assistant:

inline int invoke()
    {
        int workCount = 0;

        if (m_isRunning)
        {
            try
            {
                workCount = m_agent.doWork();
            }
            catch (const util::SourcedException &exception)
            {
                m_exceptionHandler(exception);
            }
        }

        return workCount;
    }